

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O3

void __thiscall pg::RTLSolver::run(RTLSolver *this)

{
  bitset *this_00;
  uint64_t *puVar1;
  pointer ppiVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  pointer piVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  ulong uVar8;
  ulong *puVar9;
  int *piVar10;
  ulong uVar11;
  uint *puVar12;
  uint *puVar13;
  ostream *poVar14;
  Error *this_01;
  size_t sVar15;
  ulong uVar16;
  long lVar17;
  Game *pGVar18;
  int **x;
  pointer ppiVar19;
  pointer *ppiVar20;
  
  uVar11 = ((this->super_Solver).game)->n_vertices;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar11;
  uVar8 = SUB168(auVar6 * ZEXT816(0x18),0);
  uVar16 = uVar8 + 8;
  if (0xfffffffffffffff7 < uVar8) {
    uVar16 = 0xffffffffffffffff;
  }
  if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  puVar9 = (ulong *)operator_new__(uVar16);
  *puVar9 = uVar11;
  if (uVar11 != 0) {
    memset((vector<int,_std::allocator<int>_> *)(puVar9 + 1),0,((uVar8 - 0x18) / 0x18) * 0x18 + 0x18
          );
  }
  this->tin = (vector<int,_std::allocator<int>_> *)(puVar9 + 1);
  piVar10 = (int *)operator_new__(-(ulong)(uVar11 >> 0x3e != 0) | uVar11 << 2);
  this->str = piVar10;
  bitset::resize(&this->V,uVar11);
  bitset::resize(&this->W,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->R,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->Z,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->S,((this->super_Solver).game)->n_vertices);
  this_00 = &this->G;
  bitset::operator=(this_00,(this->super_Solver).disabled);
  if ((this->G)._bitssize == 0) {
    uVar11 = 0;
  }
  else {
    puVar1 = this_00->_bits;
    uVar8 = 0;
    do {
      puVar1[uVar8] = ~puVar1[uVar8];
      uVar8 = uVar8 + 1;
      uVar11 = (this->G)._bitssize;
    } while (uVar8 < uVar11);
  }
  uVar8 = (this->G)._size & 0x3f;
  if (uVar8 != 0) {
    this_00->_bits[uVar11 - 1] = this_00->_bits[uVar11 - 1] & ~(-1L << uVar8);
  }
  pGVar18 = (this->super_Solver).game;
  puVar12 = (this->Q).queue;
  uVar11 = pGVar18->n_vertices;
  (this->Q).pointer = 0;
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
    pGVar18 = (this->super_Solver).game;
  }
  puVar12 = (uint *)operator_new__((uVar11 & 0xffffffff) << 2);
  (this->Q).queue = puVar12;
  uVar11 = pGVar18->n_vertices;
  (this->tangleto).pointer = 0;
  puVar12 = (this->tangleto).queue;
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
    pGVar18 = (this->super_Solver).game;
  }
  puVar12 = (uint *)operator_new__((uVar11 & 0xffffffff) << 2);
  (this->tangleto).queue = puVar12;
  bitset::resize(&this->escapes,pGVar18->n_vertices);
  pGVar18 = (this->super_Solver).game;
  puVar12 = (this->pea_state).queue;
  uVar11 = pGVar18->n_vertices;
  (this->pea_state).pointer = 0;
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
    pGVar18 = (this->super_Solver).game;
  }
  puVar12 = (uint *)operator_new__((uVar11 & 0x7fffffff) << 3);
  (this->pea_state).queue = puVar12;
  uVar11 = pGVar18->n_vertices;
  (this->pea_S).pointer = 0;
  puVar12 = (this->pea_S).queue;
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
    pGVar18 = (this->super_Solver).game;
  }
  puVar12 = (uint *)operator_new__((uVar11 & 0xffffffff) << 2);
  (this->pea_S).queue = puVar12;
  uVar11 = 0xffffffffffffffff;
  if ((ulong)pGVar18->n_vertices < 0x4000000000000000) {
    uVar11 = pGVar18->n_vertices * 4;
  }
  puVar13 = (uint *)operator_new__(uVar11);
  this->pea_vidx = puVar13;
  bitset::resize(&this->pea_root,pGVar18->n_vertices);
  if (this->onesided == false) {
    do {
      sVar15 = 0;
      do {
        if ((this->G)._bitssize == sVar15) goto LAB_00176b29;
        puVar1 = (this->G)._bits + sVar15;
        sVar15 = sVar15 + 1;
      } while (*puVar1 == 0);
      if ((this->super_Solver).trace != 0) {
        poVar14 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m",0x21);
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->iterations);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\x1b[m",3);
        std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
      }
      this->iterations = this->iterations + 1;
      bVar7 = rtl(this,this_00,-1,0);
    } while (bVar7);
  }
  else {
    do {
      sVar15 = 0;
      do {
        if ((this->G)._bitssize == sVar15) goto LAB_001769d4;
        puVar1 = (this->G)._bits + sVar15;
        sVar15 = sVar15 + 1;
      } while (*puVar1 == 0);
      if ((this->super_Solver).trace != 0) {
        poVar14 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"\x1b[1;38;5;196miteration\x1b[m even-\x1b[1;36m",0x26);
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->iterations);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\x1b[m",3);
        std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
      }
      this->iterations = this->iterations + 1;
      bVar7 = rtl(this,this_00,0,0);
    } while (bVar7);
LAB_001769d4:
    do {
      sVar15 = 0;
      do {
        if ((this->G)._bitssize == sVar15) goto LAB_00176b29;
        puVar1 = (this->G)._bits + sVar15;
        sVar15 = sVar15 + 1;
      } while (*puVar1 == 0);
      if ((this->super_Solver).trace != 0) {
        poVar14 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"\x1b[1;38;5;196miteration\x1b[m odd-\x1b[1;36m",0x25);
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->iterations);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\x1b[m",3);
        std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
      }
      this->iterations = this->iterations + 1;
      bVar7 = rtl(this,this_00,1,0);
    } while (bVar7);
  }
LAB_00176b29:
  poVar14 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"found ",6);
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->dominions);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," dominions and ",0xf);
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->tangles);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," tangles.",9);
  std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
  std::ostream::put((char)poVar14);
  std::ostream::flush();
  poVar14 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"solved in ",10);
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->iterations);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," iterations.",0xc);
  std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
  std::ostream::put((char)poVar14);
  std::ostream::flush();
  uVar11 = ((this->super_Solver).game)->n_vertices;
  if (0 < (long)uVar11) {
    uVar8 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
        this_01 = (Error *)__cxa_allocate_exception(0x40);
        Error::Error(this_01,"search was incomplete!",
                     "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/rtl.cpp"
                     ,0x287);
        __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
      }
      uVar8 = uVar8 + 1;
    } while (uVar11 != uVar8);
  }
  ppiVar2 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppiVar19 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppiVar19 != ppiVar2; ppiVar19 = ppiVar19 + 1) {
    if (*ppiVar19 != (int *)0x0) {
      operator_delete__(*ppiVar19);
    }
  }
  ppiVar2 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppiVar19 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppiVar19 != ppiVar2; ppiVar19 = ppiVar19 + 1) {
    if (*ppiVar19 != (int *)0x0) {
      operator_delete__(*ppiVar19);
    }
  }
  pvVar3 = this->tin;
  if (pvVar3 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar4 = pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ppiVar20 = &pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if (piVar4 != (pointer)0x0) {
      lVar17 = (long)piVar4 * 0x18;
      do {
        pvVar5 = *(void **)((long)&pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar17);
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,*(long *)((long)ppiVar20 + lVar17) - (long)pvVar5);
        }
        lVar17 = lVar17 + -0x18;
      } while (lVar17 != 0);
    }
    operator_delete__(ppiVar20,(long)piVar4 * 0x18 + 8);
  }
  if (this->str != (int *)0x0) {
    operator_delete__(this->str);
  }
  if (this->pea_vidx == (uint *)0x0) {
    return;
  }
  operator_delete__(this->pea_vidx);
  return;
}

Assistant:

void
RTLSolver::run()
{
    tin = new std::vector<int>[nodecount()];
    str = new int[nodecount()];

    V.resize(nodecount());
    W.resize(nodecount());
    R.resize(nodecount());
    Z.resize(nodecount());
    S.resize(nodecount());
    G = disabled;
    G.flip();

    Q.resize(nodecount());

    tangleto.resize(nodecount());
    escapes.resize(nodecount());

    pea_state.resize(nodecount()*2);
    pea_S.resize(nodecount());
    pea_vidx = new unsigned int[nodecount()];
    pea_root.resize(nodecount());

    if (onesided) {
        while (G.any()) {
#ifndef NDEBUG
            if (trace) logger << "\033[1;38;5;196miteration\033[m even-\033[1;36m" << iterations << "\033[m" << std::endl;
#endif
            iterations++;

            if (!rtl(G, 0, 0)) break;
        }
        while (G.any()) {
#ifndef NDEBUG
            if (trace) logger << "\033[1;38;5;196miteration\033[m odd-\033[1;36m" << iterations << "\033[m" << std::endl;
#endif
            iterations++;

            if (!rtl(G, 1, 0)) break;
        }
    } else {
        while (G.any()) {
#ifndef NDEBUG
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations << "\033[m" << std::endl;
#endif
            iterations++;

            if (!rtl(G, -1, 0)) break;
        }
    }

    logger << "found " << dominions << " dominions and "<< tangles << " tangles." << std::endl;
    logger << "solved in " << iterations << " iterations." << std::endl;

#ifndef NDEBUG
    // Check if the whole game is now solved
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { THROW_ERROR("search was incomplete!"); }
    }
#endif

    // Free all explicitly allocated memory
    for (auto &x : tv) delete[] x;
    for (auto &x : tout) delete[] x;
    delete[] tin;
    delete[] str;
    delete[] pea_vidx;
}